

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O1

void __thiscall helix::order_book::add(order_book *this,order order)

{
  _Rb_tree_iterator<std::pair<const_unsigned_long,_helix::price_level>_> _Var1;
  invalid_argument *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_helix::price_level>_>,_bool> pVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (order.side == sell) {
    local_60._M_dataplus._M_p = (pointer)order.price;
    local_40._M_dataplus._M_p = (pointer)order.price;
    local_40._M_string_length = 0;
    pVar2 = std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,helix::price_level>,std::_Select1st<std::pair<unsigned_long_const,helix::price_level>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>
            ::_M_emplace_unique<unsigned_long&,helix::price_level&>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,helix::price_level>,std::_Select1st<std::pair<unsigned_long_const,helix::price_level>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>
                        *)&this->_asks,(unsigned_long *)&local_60,(price_level *)&local_40);
    _Var1 = pVar2.first._M_node;
  }
  else {
    if (order.side != buy) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"invalid side: ","");
      std::operator+(&local_40,&local_60,order.side);
      std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    local_60._M_dataplus._M_p = (pointer)order.price;
    local_40._M_dataplus._M_p = (pointer)order.price;
    local_40._M_string_length = 0;
    pVar2 = std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,helix::price_level>,std::_Select1st<std::pair<unsigned_long_const,helix::price_level>>,std::greater<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>
            ::_M_emplace_unique<unsigned_long&,helix::price_level&>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,helix::price_level>,std::_Select1st<std::pair<unsigned_long_const,helix::price_level>>,std::greater<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>
                        *)&this->_bids,(unsigned_long *)&local_60,(price_level *)&local_40);
    _Var1 = pVar2.first._M_node;
  }
  order.level = (price_level *)&_Var1._M_node[1]._M_parent;
  _Var1._M_node[1]._M_left =
       (_Base_ptr)((long)&(_Var1._M_node[1]._M_left)->_M_color + order.quantity);
  boost::multi_index::
  multi_index_container<helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>
  ::emplace_<helix::order>(&this->_orders,&order);
  return;
}

Assistant:

void order_book::add(order order)
{
    switch (order.side) {
    case side_type::buy: {
        auto&& level = lookup_or_create(_bids, order.price);
        order.level = &level;
        level.size += order.quantity;
        break;
    }
    case side_type::sell: {
        auto&& level = lookup_or_create(_asks, order.price);
        order.level = &level;
        level.size += order.quantity;
        break;
    }
    default:
        throw std::invalid_argument(std::string("invalid side: ") + static_cast<char>(order.side));
    }
    _orders.emplace(std::move(order));
}